

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void terminal_setflags(EditLine *el)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  EditLine *el_local;
  
  (el->el_terminal).t_flags = L'\0';
  if ((el->el_tty).t_tabs != L'\0') {
    bVar3 = false;
    if ((el->el_terminal).t_val[1] != L'\0') {
      bVar3 = (el->el_terminal).t_val[5] == L'\0';
    }
    uVar2 = 0;
    if (bVar3) {
      uVar2 = 8;
    }
    (el->el_terminal).t_flags = uVar2 | (el->el_terminal).t_flags;
  }
  bVar3 = true;
  if ((el->el_terminal).t_val[4] == L'\0') {
    bVar3 = (el->el_terminal).t_val[7] != L'\0';
  }
  uVar2 = 0;
  if (bVar3) {
    uVar2 = 0x40;
  }
  (el->el_terminal).t_flags = uVar2 | (el->el_terminal).t_flags;
  bVar3 = false;
  if ((el->el_terminal).t_str[3] != (char *)0x0) {
    bVar3 = *(el->el_terminal).t_str[3] != '\0';
  }
  uVar2 = 0;
  if (bVar3) {
    uVar2 = 4;
  }
  (el->el_terminal).t_flags = uVar2 | (el->el_terminal).t_flags;
  if ((((el->el_terminal).t_str[6] == (char *)0x0) ||
      (bVar3 = true, *(el->el_terminal).t_str[6] == '\0')) &&
     (bVar3 = false, (el->el_terminal).t_str[0x1e] != (char *)0x0)) {
    bVar3 = *(el->el_terminal).t_str[0x1e] != '\0';
  }
  uVar2 = 0;
  if (bVar3) {
    uVar2 = 2;
  }
  (el->el_terminal).t_flags = uVar2 | (el->el_terminal).t_flags;
  if (((((el->el_terminal).t_str[0xe] == (char *)0x0) ||
       (bVar3 = true, *(el->el_terminal).t_str[0xe] == '\0')) &&
      (((el->el_terminal).t_str[0xd] == (char *)0x0 ||
       (bVar3 = true, *(el->el_terminal).t_str[0xd] == '\0')))) &&
     (bVar3 = false, (el->el_terminal).t_str[0x20] != (char *)0x0)) {
    bVar3 = *(el->el_terminal).t_str[0x20] != '\0';
  }
  (el->el_terminal).t_flags = (uint)bVar3 | (el->el_terminal).t_flags;
  if ((((el->el_terminal).t_str[0x1a] == (char *)0x0) ||
      (bVar3 = true, *(el->el_terminal).t_str[0x1a] == '\0')) &&
     (bVar3 = false, (el->el_terminal).t_str[0x23] != (char *)0x0)) {
    bVar3 = *(el->el_terminal).t_str[0x23] != '\0';
  }
  uVar2 = 0;
  if (bVar3) {
    uVar2 = 0x20;
  }
  (el->el_terminal).t_flags = uVar2 | (el->el_terminal).t_flags;
  uVar2 = 0;
  if (*(el->el_terminal).t_val != L'\0') {
    uVar2 = 0x80;
  }
  (el->el_terminal).t_flags = uVar2 | (el->el_terminal).t_flags;
  uVar2 = 0;
  if ((el->el_terminal).t_val[6] != L'\0') {
    uVar2 = 0x100;
  }
  (el->el_terminal).t_flags = uVar2 | (el->el_terminal).t_flags;
  if (((((el->el_terminal).t_str[0x15] == (char *)0x0) || (*(el->el_terminal).t_str[0x15] == '\0'))
      || ((el->el_terminal).t_str[0x1c] == (char *)0x0)) || (*(el->el_terminal).t_str[0x1c] == '\0')
     ) {
    (el->el_terminal).t_flags = (el->el_terminal).t_flags & 0xffffffef;
  }
  else {
    iVar1 = strcmp((el->el_terminal).t_str[0x15],(el->el_terminal).t_str[0x1c]);
    uVar2 = 0;
    if (iVar1 == 0) {
      uVar2 = 0x10;
    }
    (el->el_terminal).t_flags = uVar2 | (el->el_terminal).t_flags;
  }
  if ((((el->el_terminal).t_str[0x15] != (char *)0x0) && (*(el->el_terminal).t_str[0x15] != '\0'))
     && (((el->el_terminal).t_str[0x17] != (char *)0x0 && (*(el->el_terminal).t_str[0x17] != '\0')))
     ) {
    iVar1 = strcmp((el->el_terminal).t_str[0x15],(el->el_terminal).t_str[0x17]);
    uVar2 = 0;
    if (iVar1 == 0) {
      uVar2 = 0x10;
    }
    (el->el_terminal).t_flags = uVar2 | (el->el_terminal).t_flags;
  }
  return;
}

Assistant:

static void
terminal_setflags(EditLine *el)
{
	EL_FLAGS = 0;
	if (el->el_tty.t_tabs)
		EL_FLAGS |= (Val(T_pt) && !Val(T_xt)) ? TERM_CAN_TAB : 0;

	EL_FLAGS |= (Val(T_km) || Val(T_MT)) ? TERM_HAS_META : 0;
	EL_FLAGS |= GoodStr(T_ce) ? TERM_CAN_CEOL : 0;
	EL_FLAGS |= (GoodStr(T_dc) || GoodStr(T_DC)) ? TERM_CAN_DELETE : 0;
	EL_FLAGS |= (GoodStr(T_im) || GoodStr(T_ic) || GoodStr(T_IC)) ?
	    TERM_CAN_INSERT : 0;
	EL_FLAGS |= (GoodStr(T_up) || GoodStr(T_UP)) ? TERM_CAN_UP : 0;
	EL_FLAGS |= Val(T_am) ? TERM_HAS_AUTO_MARGINS : 0;
	EL_FLAGS |= Val(T_xn) ? TERM_HAS_MAGIC_MARGINS : 0;

	if (GoodStr(T_me) && GoodStr(T_ue))
		EL_FLAGS |= (strcmp(Str(T_me), Str(T_ue)) == 0) ?
		    TERM_CAN_ME : 0;
	else
		EL_FLAGS &= ~TERM_CAN_ME;
	if (GoodStr(T_me) && GoodStr(T_se))
		EL_FLAGS |= (strcmp(Str(T_me), Str(T_se)) == 0) ?
		    TERM_CAN_ME : 0;


#ifdef DEBUG_SCREEN
	if (!EL_CAN_UP) {
		(void) fprintf(el->el_errfile,
		    "WARNING: Your terminal cannot move up.\n");
		(void) fprintf(el->el_errfile,
		    "Editing may be odd for long lines.\n");
	}
	if (!EL_CAN_CEOL)
		(void) fprintf(el->el_errfile, "no clear EOL capability.\n");
	if (!EL_CAN_DELETE)
		(void) fprintf(el->el_errfile, "no delete char capability.\n");
	if (!EL_CAN_INSERT)
		(void) fprintf(el->el_errfile, "no insert char capability.\n");
#endif /* DEBUG_SCREEN */
}